

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O1

long ogg_sync_pageseek(ogg_sync_state *oy,ogg_page *og)

{
  int iVar1;
  uchar *puVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  char chksum [4];
  ogg_page log;
  ogg_page local_48;
  
  if (oy->storage < 0) {
LAB_001e571a:
    lVar7 = 0;
  }
  else {
    piVar5 = (int *)(oy->data + oy->returned);
    lVar7 = (long)oy->fill - (long)oy->returned;
    iVar6 = (int)lVar7;
    if (oy->headerbytes == 0) {
      iVar3 = 1;
      if ((0x1a < iVar6) && (iVar3 = 2, *piVar5 == 0x5367674f)) {
        iVar1 = *(byte *)((long)piVar5 + 0x1a) + 0x1b;
        iVar3 = 1;
        if (iVar1 <= iVar6) {
          if (*(char *)((long)piVar5 + 0x1a) != '\0') {
            uVar4 = 0;
            do {
              oy->bodybytes = oy->bodybytes + (uint)*(byte *)((long)piVar5 + uVar4 + 0x1b);
              uVar4 = uVar4 + 1;
            } while (uVar4 < *(byte *)((long)piVar5 + 0x1a));
          }
          oy->headerbytes = iVar1;
          iVar3 = 0;
        }
      }
      if (iVar3 != 2) {
        if (iVar3 != 0) goto LAB_001e571a;
        goto LAB_001e566c;
      }
    }
    else {
LAB_001e566c:
      if (iVar6 < oy->headerbytes + oy->bodybytes) goto LAB_001e571a;
      iVar6 = *(int *)((long)piVar5 + 0x16);
      *(undefined4 *)((long)piVar5 + 0x16) = 0;
      local_48.header_len = (long)oy->headerbytes;
      local_48.body = (uchar *)(local_48.header_len + (long)piVar5);
      local_48.body_len = (long)oy->bodybytes;
      local_48.header = (uchar *)piVar5;
      ogg_page_checksum_set(&local_48);
      if (iVar6 == *(int *)((long)piVar5 + 0x16)) {
        if (og != (ogg_page *)0x0) {
          og->header = (uchar *)piVar5;
          iVar6 = oy->headerbytes;
          og->header_len = (long)iVar6;
          og->body = (uchar *)((long)piVar5 + (long)iVar6);
          og->body_len = (long)oy->bodybytes;
        }
        oy->unsynced = 0;
        lVar7 = (long)oy->bodybytes + (long)oy->headerbytes;
        oy->returned = oy->returned + (int)lVar7;
        oy->headerbytes = 0;
        oy->bodybytes = 0;
        return lVar7;
      }
      *(int *)((long)piVar5 + 0x16) = iVar6;
    }
    oy->headerbytes = 0;
    oy->bodybytes = 0;
    puVar2 = (uchar *)memchr((void *)((long)piVar5 + 1),0x4f,lVar7 - 1);
    if (puVar2 == (uchar *)0x0) {
      puVar2 = oy->data + oy->fill;
    }
    oy->returned = (int)puVar2 - *(int *)&oy->data;
    lVar7 = (long)piVar5 - (long)puVar2;
  }
  return lVar7;
}

Assistant:

long ogg_sync_pageseek(ogg_sync_state *oy,ogg_page *og){
  unsigned char *page=oy->data+oy->returned;
  unsigned char *next;
  long bytes=oy->fill-oy->returned;

  if(ogg_sync_check(oy))return 0;

  if(oy->headerbytes==0){
    int headerbytes,i;
    if(bytes<27)return(0); /* not enough for a header */

    /* verify capture pattern */
    if(memcmp(page,"OggS",4))goto sync_fail;

    headerbytes=page[26]+27;
    if(bytes<headerbytes)return(0); /* not enough for header + seg table */

    /* count up body length in the segment table */

    for(i=0;i<page[26];i++)
      oy->bodybytes+=page[27+i];
    oy->headerbytes=headerbytes;
  }

  if(oy->bodybytes+oy->headerbytes>bytes)return(0);

  /* The whole test page is buffered.  Verify the checksum */
  {
    /* Grab the checksum bytes, set the header field to zero */
    char chksum[4];
    ogg_page log;

    memcpy(chksum,page+22,4);
    memset(page+22,0,4);

    /* set up a temp page struct and recompute the checksum */
    log.header=page;
    log.header_len=oy->headerbytes;
    log.body=page+oy->headerbytes;
    log.body_len=oy->bodybytes;
    ogg_page_checksum_set(&log);

    /* Compare */
    if(memcmp(chksum,page+22,4)){
      /* D'oh.  Mismatch! Corrupt page (or miscapture and not a page
         at all) */
      /* replace the computed checksum with the one actually read in */
      memcpy(page+22,chksum,4);

#ifndef DISABLE_CRC
      /* Bad checksum. Lose sync */
      goto sync_fail;
#endif
    }
  }

  /* yes, have a whole page all ready to go */
  {
    if(og){
      og->header=page;
      og->header_len=oy->headerbytes;
      og->body=page+oy->headerbytes;
      og->body_len=oy->bodybytes;
    }

    oy->unsynced=0;
    oy->returned+=(bytes=oy->headerbytes+oy->bodybytes);
    oy->headerbytes=0;
    oy->bodybytes=0;
    return(bytes);
  }

 sync_fail:

  oy->headerbytes=0;
  oy->bodybytes=0;

  /* search for possible capture */
  next=memchr(page+1,'O',bytes-1);
  if(!next)
    next=oy->data+oy->fill;

  oy->returned=(int)(next-oy->data);
  return((long)-(next-page));
}